

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::operator()
          (quadratic_cost_type<double> *this,int index,bit_array *x)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  double dVar7;
  
  lVar4 = (long)index;
  piVar5 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  dVar7 = (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
          ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl[lVar4];
  iVar1 = piVar5[lVar4];
  iVar3 = piVar5[lVar4 + 1];
  if (iVar3 != iVar1) {
    piVar5 = &(this->quadratic_elements)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
              .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
              _M_head_impl[iVar1].id;
    iVar3 = iVar3 - iVar1;
    do {
      uVar2 = *piVar5;
      uVar6 = uVar2 + 0x3f;
      if (-1 < (int)uVar2) {
        uVar6 = uVar2;
      }
      if (((x->super_bit_array_impl).m_data._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar6 >> 6] >>
           ((ulong)uVar2 & 0x3f) & 1) != 0) {
        dVar7 = dVar7 + ((quad *)(piVar5 + -2))->factor;
      }
      piVar5 = piVar5 + 4;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return dVar7;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }